

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

json * __thiscall inja::Renderer::get_imm_abi_cxx11_(Renderer *this,Bytecode *bc)

{
  json *pjVar1;
  CallbackFunction callback;
  string ptr_buffer;
  
  pjVar1 = (json *)(*(code *)(&DAT_00485100 +
                             *(int *)(&DAT_00485100 + (ulong)(*(uint *)&bc->field_0x4 >> 0x1e) * 4))
                   )();
  return pjVar1;
}

Assistant:

const json* get_imm(const Bytecode& bc) {
		std::string ptr_buffer;
		nonstd::string_view ptr;
		switch (bc.flags & Bytecode::Flag::ValueMask) {
			case Bytecode::Flag::ValuePop:
				return nullptr;
			case Bytecode::Flag::ValueImmediate:
				return &bc.value;
			case Bytecode::Flag::ValueLookupDot:
				ptr = convert_dot_to_json_pointer(bc.str, ptr_buffer);
				break;
			case Bytecode::Flag::ValueLookupPointer:
				ptr_buffer += '/';
				ptr_buffer += bc.str;
				ptr = ptr_buffer;
				break;
		}
		try {
			return &m_data->at(json::json_pointer(ptr.data()));
		} catch (std::exception&) {
			// try to evaluate as a no-argument callback
			if (auto callback = m_callbacks.find_callback(bc.str, 0)) {
				std::vector<const json*> arguments{};
				m_tmp_val = callback(arguments);
				return &m_tmp_val;
			}
			inja_throw("render_error", "variable '" + static_cast<std::string>(bc.str) + "' not found");
			return nullptr;
		}
	}